

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

IReporter * __thiscall
Catch::ReporterRegistry::create(ReporterRegistry *this,string *name,ReporterConfig *config)

{
  bool bVar1;
  int iVar2;
  pointer ppVar3;
  undefined4 extraout_var;
  _Self local_38;
  _Self local_30;
  const_iterator it;
  ReporterConfig *config_local;
  string *name_local;
  ReporterRegistry *this_local;
  
  it._M_node = (_Base_ptr)config;
  local_30._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::IReporterFactory_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::IReporterFactory_*>_>_>
       ::find(&this->m_factories,name);
  local_38._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::IReporterFactory_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::IReporterFactory_*>_>_>
       ::end(&this->m_factories);
  bVar1 = std::operator==(&local_30,&local_38);
  if (bVar1) {
    this_local = (ReporterRegistry *)0x0;
  }
  else {
    ppVar3 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::IReporterFactory_*>_>
             ::operator->(&local_30);
    iVar2 = (*ppVar3->second->_vptr_IReporterFactory[2])(ppVar3->second,it._M_node);
    this_local = (ReporterRegistry *)CONCAT44(extraout_var,iVar2);
  }
  return (IReporter *)this_local;
}

Assistant:

virtual IReporter* create( const std::string& name, const ReporterConfig& config ) const {
            FactoryMap::const_iterator it =  m_factories.find( name );
            if( it == m_factories.end() )
                return NULL;
            return it->second->create( config );
        }